

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  cmake *pcVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  allocator local_2b9;
  string local_2b8 [8];
  string msg_1;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  ostringstream e;
  undefined1 local_98 [8];
  string currentStartFile;
  string local_70 [8];
  string msg;
  allocator local_39;
  undefined1 local_38 [8];
  string currentStart;
  cmMakefile *mf_local;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = mf;
  InitializeFromParent(mf,this);
  pcVar3 = GetCurrentSourceDirectory((cmMakefile *)currentStart.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,pcVar3,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar4 = GetCMakeInstance(this);
  bVar1 = cmake::GetDebugOutput(pcVar4);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"   Entering             ",
               (allocator *)(currentStartFile.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(currentStartFile.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=(local_70,(string *)local_38);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Message(pcVar3,(char *)0x0);
    std::__cxx11::string::~string(local_70);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "/CMakeLists.txt");
  bVar1 = cmsys::SystemTools::FileExists((string *)local_98,true);
  if (bVar1) {
    Configure((cmMakefile *)currentStart.field_2._8_8_);
    pcVar4 = GetCMakeInstance(this);
    bVar1 = cmake::GetDebugOutput(pcVar4);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,"   Returning to         ",&local_2b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      pcVar3 = GetCurrentSourceDirectory(this);
      std::__cxx11::string::operator+=(local_2b8,pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar3,(char *)0x0);
      std::__cxx11::string::~string(local_2b8);
    }
    msg_1.field_2._12_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    poVar5 = std::operator<<((ostream *)local_210,"The source directory\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)local_38);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"does not contain a CMakeLists.txt file.");
    PVar2 = GetPolicyStatus(this,CMP0014);
    switch(PVar2) {
    case WARN:
      poVar5 = std::operator<<((ostream *)local_210,"\n");
      poVar5 = std::operator<<(poVar5,"CMake does not support this case but it used ");
      poVar5 = std::operator<<(poVar5,"to work accidentally and is being allowed for ");
      poVar5 = std::operator<<(poVar5,"compatibility.");
      poVar5 = std::operator<<(poVar5,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_230,(cmPolicies *)0xe,id);
      std::operator<<(poVar5,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_250,false);
      std::__cxx11::string::~string((string *)&local_250);
    case OLD:
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      poVar5 = std::operator<<((ostream *)local_210,"\n");
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_270,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar5,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
    case NEW:
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_290,false);
      std::__cxx11::string::~string((string *)&local_290);
    }
    msg_1.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile *mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Entering             ";
    msg += currentStart;
    cmSystemTools::Message(msg.c_str());
    }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true))
    {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    switch (this->GetPolicyStatus(cmPolicies::CMP0014))
      {
      case cmPolicies::WARN:
        // Print the warning.
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n"
          << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(cmake::FATAL_ERROR, e.str());
      }
    return;
    }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput())
    {
    std::string msg="   Returning to         ";
    msg += this->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str());
    }
}